

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offset64_test.cpp
# Opt level: O1

void flatbuffers::tests::Offset64VectorOfStructs(void)

{
  bool expval;
  ushort uVar1;
  Offset<RootTable> root;
  uint *puVar2;
  int *piVar3;
  long *plVar4;
  ulong *puVar5;
  char *__function;
  int *piVar6;
  vector<LeafStruct,_std::allocator<LeafStruct>_> big_leaves;
  vector<LeafStruct,_std::allocator<LeafStruct>_> far_leaves;
  FlatBufferBuilder64 builder;
  vector<LeafStruct,_std::allocator<LeafStruct>_> local_108;
  vector<LeafStruct,_std::allocator<LeafStruct>_> local_e8;
  VerifierTemplate<false> local_d0;
  FlatBufferBuilder64 local_88;
  
  local_88.buf_.allocator_ = (Allocator *)0x0;
  local_88.buf_.own_allocator_ = false;
  local_88.buf_.initial_size_ = 0x400;
  local_88.buf_.max_size_ = 0x7fffffffffffffff;
  local_88.buf_.buffer_minalign_ = 8;
  local_88.length_of_64_bit_region_ = 0;
  local_88.nested = false;
  local_88.finished = false;
  local_88.buf_.reserved_ = 0;
  local_88.buf_.size_ = 0;
  local_88.buf_.buf_ = (uint8_t *)0x0;
  local_88.buf_.cur_._0_6_ = 0;
  local_88.buf_.cur_._6_2_ = 0;
  local_88.buf_.scratch_._0_6_ = 0;
  local_88._78_8_ = 0;
  local_88.minalign_ = 1;
  local_88.force_defaults_ = false;
  local_88.dedup_vtables_ = true;
  local_88.string_pool = (StringOffsetMap *)0x0;
  local_e8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (LeafStruct *)0x0;
  local_e8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
  super__Vector_impl_data._M_finish = (LeafStruct *)0x0;
  local_d0.buf_ = (uint8_t *)0x7b;
  local_d0.size_ = 0x4012449ba5e353f8;
  std::vector<LeafStruct,_std::allocator<LeafStruct>_>::_M_realloc_insert<LeafStruct>
            (&local_e8,(iterator)0x0,(LeafStruct *)&local_d0);
  local_d0.buf_ = (uint8_t *)0x3db;
  local_d0.size_ = 0x401a2c083126e979;
  if (local_e8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_e8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<LeafStruct,_std::allocator<LeafStruct>_>::_M_realloc_insert<LeafStruct>
              (&local_e8,
               (iterator)
               local_e8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
               super__Vector_impl_data._M_finish,(LeafStruct *)&local_d0);
  }
  else {
    (local_e8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
     super__Vector_impl_data._M_finish)->a_ = 0x3db;
    (local_e8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
     super__Vector_impl_data._M_finish)->padding0__ = 0;
    (local_e8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
     super__Vector_impl_data._M_finish)->b_ = 6.543;
    local_e8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_e8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_108.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
  super__Vector_impl_data._M_finish = (LeafStruct *)0x0;
  local_108.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (LeafStruct *)0x0;
  local_d0.buf_ = (uint8_t *)0x48;
  local_d0.size_ = 0x4052333333333333;
  std::vector<LeafStruct,_std::allocator<LeafStruct>_>::_M_realloc_insert<LeafStruct>
            (&local_108,(iterator)0x0,(LeafStruct *)&local_d0);
  local_d0.buf_ = (uint8_t *)0x52;
  local_d0.size_ = 0x4054b33333333333;
  if (local_108.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_108.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<LeafStruct,_std::allocator<LeafStruct>_>::_M_realloc_insert<LeafStruct>
              (&local_108,
               (iterator)
               local_108.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
               super__Vector_impl_data._M_finish,(LeafStruct *)&local_d0);
  }
  else {
    (local_108.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
     super__Vector_impl_data._M_finish)->a_ = 0x52;
    (local_108.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
     super__Vector_impl_data._M_finish)->padding0__ = 0;
    (local_108.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
     super__Vector_impl_data._M_finish)->b_ = 82.8;
    local_108.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_108.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_d0.buf_ = (uint8_t *)0x5c;
  local_d0.size_ = 0x4057333333333333;
  if (local_108.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_108.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<LeafStruct,_std::allocator<LeafStruct>_>::_M_realloc_insert<LeafStruct>
              (&local_108,
               (iterator)
               local_108.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
               super__Vector_impl_data._M_finish,(LeafStruct *)&local_d0);
  }
  else {
    (local_108.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
     super__Vector_impl_data._M_finish)->a_ = 0x5c;
    (local_108.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
     super__Vector_impl_data._M_finish)->padding0__ = 0;
    (local_108.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
     super__Vector_impl_data._M_finish)->b_ = 92.8;
    local_108.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_108.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  root = CreateRootTableDirect
                   (&local_88,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,0,
                    (char *)0x0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,
                    (char *)0x0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,
                    &local_e8,&local_108,
                    (vector<flatbuffers::Offset<WrapperTable>,_std::allocator<flatbuffers::Offset<WrapperTable>_>_>
                     *)0x0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0);
  FlatBufferBuilderImpl<true>::Finish(&local_88,root.o,(char *)0x0,false);
  local_d0.buf_ = FlatBufferBuilderImpl<true>::GetBufferPointer(&local_88);
  local_d0.size_ = local_88.buf_.size_;
  local_d0.opts_.max_depth = 0x40;
  local_d0.opts_.max_tables = 1000000;
  local_d0.opts_.check_alignment = true;
  local_d0.opts_.check_nested_flatbuffers = true;
  local_d0.opts_.max_size = 0x7fffffffffffffff;
  local_d0.opts_.assert = true;
  local_d0.upper_bound_ = 0;
  local_d0.depth_ = 0;
  local_d0.num_tables_ = 0;
  local_d0.flex_reuse_tracker_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  if (0x7ffffffffffffffe < local_88.buf_.size_) {
    __assert_fail("size_ < opts.max_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/verifier.h"
                  ,0x2f,
                  "flatbuffers::VerifierTemplate<false>::VerifierTemplate(const uint8_t *const, const size_t, const Options &) [TrackVerifierBufferSize = false]"
                 );
  }
  expval = VerifierTemplate<false>::VerifyBufferFromStart<RootTable>(&local_d0,(char *)0x0,0);
  TestEq<bool,bool>(expval,true,"\'VerifyRootTableBuffer(verifier)\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                    ,0x141,"");
  puVar2 = (uint *)FlatBufferBuilderImpl<true>::GetBufferPointer(&local_88);
  if (puVar2 == (uint *)0x0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)((ulong)*puVar2 + (long)puVar2);
  }
  if (*(ushort *)((long)piVar6 - (long)*piVar6) < 0x11) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)((long)piVar6 + (0x10 - (long)*piVar6));
  }
  TestEq<unsigned_int,unsigned_long>
            (*(uint *)((long)piVar6 + *(long *)((long)piVar6 + (ulong)uVar1) + (ulong)uVar1),
             (long)local_e8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_e8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
                   super__Vector_impl_data._M_start >> 4,
             "\'root_table->far_struct_vector()->size()\' != \'far_leaves.size()\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x145,"");
  if (*(ushort *)((long)piVar6 - (long)*piVar6) < 0x11) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)((long)piVar6 + (0x10 - (long)*piVar6));
  }
  if (uVar1 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)((long)piVar6 + *(long *)((long)piVar6 + (ulong)uVar1) + (ulong)uVar1);
  }
  if (*piVar3 != 0) {
    TestEq<int,int>(piVar3[1],0x7b,"\'root_table->far_struct_vector()->Get(0)->a()\' != \'123\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                    ,0x146,"");
    if (*(ushort *)((long)piVar6 - (long)*piVar6) < 0x11) {
      uVar1 = 0;
    }
    else {
      uVar1 = *(ushort *)((long)piVar6 + (0x10 - (long)*piVar6));
    }
    if (uVar1 == 0) {
      piVar3 = (int *)0x0;
    }
    else {
      piVar3 = (int *)((long)piVar6 + *(long *)((long)piVar6 + (ulong)uVar1) + (ulong)uVar1);
    }
    if (*piVar3 != 0) {
      TestEq<double,double>
                (*(double *)(piVar3 + 3),4.567,
                 "\'root_table->far_struct_vector()->Get(0)->b()\' != \'4.567\'",
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                 ,0x147,"");
      if (*(ushort *)((long)piVar6 - (long)*piVar6) < 0x11) {
        uVar1 = 0;
      }
      else {
        uVar1 = *(ushort *)((long)piVar6 + (0x10 - (long)*piVar6));
      }
      if (uVar1 == 0) {
        puVar2 = (uint *)0x0;
      }
      else {
        puVar2 = (uint *)((long)piVar6 + *(long *)((long)piVar6 + (ulong)uVar1) + (ulong)uVar1);
      }
      if (1 < *puVar2) {
        TestEq<int,int>(puVar2[5],0x3db,
                        "\'root_table->far_struct_vector()->Get(1)->a()\' != \'987\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                        ,0x148,"");
        if (*(ushort *)((long)piVar6 - (long)*piVar6) < 0x11) {
          uVar1 = 0;
        }
        else {
          uVar1 = *(ushort *)((long)piVar6 + (0x10 - (long)*piVar6));
        }
        if (uVar1 == 0) {
          puVar2 = (uint *)0x0;
        }
        else {
          puVar2 = (uint *)((long)piVar6 + *(long *)((long)piVar6 + (ulong)uVar1) + (ulong)uVar1);
        }
        if (1 < *puVar2) {
          TestEq<double,double>
                    (*(double *)(puVar2 + 7),6.543,
                     "\'root_table->far_struct_vector()->Get(1)->b()\' != \'6.543\'",
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                     ,0x149,"");
          if (*(ushort *)((long)piVar6 - (long)*piVar6) < 0x13) {
            uVar1 = 0;
          }
          else {
            uVar1 = *(ushort *)((long)piVar6 + (0x12 - (long)*piVar6));
          }
          TestEq<unsigned_long,unsigned_long>
                    (*(unsigned_long *)
                      ((long)piVar6 + *(long *)((long)piVar6 + (ulong)uVar1) + (ulong)uVar1),
                     (long)local_108.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_108.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 4,
                     "\'root_table->big_struct_vector()->size()\' != \'big_leaves.size()\'",
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                     ,0x14b,"");
          if (*(ushort *)((long)piVar6 - (long)*piVar6) < 0x13) {
            uVar1 = 0;
          }
          else {
            uVar1 = *(ushort *)((long)piVar6 + (0x12 - (long)*piVar6));
          }
          if (uVar1 == 0) {
            plVar4 = (long *)0x0;
          }
          else {
            plVar4 = (long *)((long)piVar6 + *(long *)((long)piVar6 + (ulong)uVar1) + (ulong)uVar1);
          }
          if (*plVar4 != 0) {
            TestEq<int,int>((int)plVar4[1],0x48,
                            "\'root_table->big_struct_vector()->Get(0)->a()\' != \'72\'",
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                            ,0x14c,"");
            if (*(ushort *)((long)piVar6 - (long)*piVar6) < 0x13) {
              uVar1 = 0;
            }
            else {
              uVar1 = *(ushort *)((long)piVar6 + (0x12 - (long)*piVar6));
            }
            if (uVar1 == 0) {
              plVar4 = (long *)0x0;
            }
            else {
              plVar4 = (long *)((long)piVar6 + *(long *)((long)piVar6 + (ulong)uVar1) + (ulong)uVar1
                               );
            }
            if (*plVar4 != 0) {
              TestEq<double,double>
                        ((double)plVar4[2],72.8,
                         "\'root_table->big_struct_vector()->Get(0)->b()\' != \'72.8\'",
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                         ,0x14d,"");
              if (*(ushort *)((long)piVar6 - (long)*piVar6) < 0x13) {
                uVar1 = 0;
              }
              else {
                uVar1 = *(ushort *)((long)piVar6 + (0x12 - (long)*piVar6));
              }
              if (uVar1 == 0) {
                puVar5 = (ulong *)0x0;
              }
              else {
                puVar5 = (ulong *)((long)piVar6 +
                                  *(long *)((long)piVar6 + (ulong)uVar1) + (ulong)uVar1);
              }
              if (1 < *puVar5) {
                TestEq<int,int>((int)puVar5[3],0x52,
                                "\'root_table->big_struct_vector()->Get(1)->a()\' != \'82\'",
                                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                                ,0x14e,"");
                if (*(ushort *)((long)piVar6 - (long)*piVar6) < 0x13) {
                  uVar1 = 0;
                }
                else {
                  uVar1 = *(ushort *)((long)piVar6 + (0x12 - (long)*piVar6));
                }
                if (uVar1 == 0) {
                  puVar5 = (ulong *)0x0;
                }
                else {
                  puVar5 = (ulong *)((long)piVar6 +
                                    *(long *)((long)piVar6 + (ulong)uVar1) + (ulong)uVar1);
                }
                if (1 < *puVar5) {
                  TestEq<double,double>
                            ((double)puVar5[4],82.8,
                             "\'root_table->big_struct_vector()->Get(1)->b()\' != \'82.8\'",
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                             ,0x14f,"");
                  if (*(ushort *)((long)piVar6 - (long)*piVar6) < 0x13) {
                    uVar1 = 0;
                  }
                  else {
                    uVar1 = *(ushort *)((long)piVar6 + (0x12 - (long)*piVar6));
                  }
                  if (uVar1 == 0) {
                    puVar5 = (ulong *)0x0;
                  }
                  else {
                    puVar5 = (ulong *)((long)piVar6 +
                                      *(long *)((long)piVar6 + (ulong)uVar1) + (ulong)uVar1);
                  }
                  if (2 < *puVar5) {
                    TestEq<int,int>((int)puVar5[5],0x5c,
                                    "\'root_table->big_struct_vector()->Get(2)->a()\' != \'92\'",
                                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                                    ,0x150,"");
                    if (*(ushort *)((long)piVar6 - (long)*piVar6) < 0x13) {
                      uVar1 = 0;
                    }
                    else {
                      uVar1 = *(ushort *)((long)piVar6 + (0x12 - (long)*piVar6));
                    }
                    if (uVar1 == 0) {
                      puVar5 = (ulong *)0x0;
                    }
                    else {
                      puVar5 = (ulong *)((long)piVar6 +
                                        *(long *)((long)piVar6 + (ulong)uVar1) + (ulong)uVar1);
                    }
                    if (2 < *puVar5) {
                      TestEq<double,double>
                                ((double)puVar5[6],92.8,
                                 "\'root_table->big_struct_vector()->Get(2)->b()\' != \'92.8\'",
                                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                                 ,0x151,"");
                      if (local_108.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_108.
                                        super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>.
                                        _M_impl.super__Vector_impl_data._M_start,
                                        (long)local_108.
                                              super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_108.
                                              super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (local_e8.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_e8.
                                        super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>.
                                        _M_impl.super__Vector_impl_data._M_start,
                                        (long)local_e8.
                                              super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_e8.
                                              super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      FlatBufferBuilderImpl<true>::~FlatBufferBuilderImpl(&local_88);
                      return;
                    }
                  }
                }
              }
            }
          }
          __function = 
          "return_type flatbuffers::Vector<const LeafStruct *, unsigned long>::Get(SizeT) const [T = const LeafStruct *, SizeT = unsigned long]"
          ;
          goto LAB_001aff3a;
        }
      }
    }
  }
  __function = 
  "return_type flatbuffers::Vector<const LeafStruct *>::Get(SizeT) const [T = const LeafStruct *, SizeT = unsigned int]"
  ;
LAB_001aff3a:
  __assert_fail("i < size()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector.h"
                ,0xc1,__function);
}

Assistant:

void Offset64VectorOfStructs() {
  FlatBufferBuilder64 builder;

  std::vector<LeafStruct> far_leaves;
  far_leaves.emplace_back(LeafStruct{ 123, 4.567 });
  far_leaves.emplace_back(LeafStruct{ 987, 6.543 });

  std::vector<LeafStruct> big_leaves;
  big_leaves.emplace_back(LeafStruct{ 72, 72.8 });
  big_leaves.emplace_back(LeafStruct{ 82, 82.8 });
  big_leaves.emplace_back(LeafStruct{ 92, 92.8 });

  // Add the two vectors of leaf structs.
  const Offset<RootTable> root_table_offset =
      CreateRootTableDirect(builder, nullptr, 0, nullptr, nullptr, nullptr,
                            nullptr, &far_leaves, &big_leaves);

  // Finish the buffer.
  builder.Finish(root_table_offset);

  Verifier::Options options;
  // Allow the verifier to verify 64-bit buffers.
  options.max_size = FLATBUFFERS_MAX_64_BUFFER_SIZE;
  options.assert = true;

  Verifier verifier(builder.GetBufferPointer(), builder.GetSize(), options);

  TEST_EQ(VerifyRootTableBuffer(verifier), true);

  // Verify the data.
  const RootTable *root_table = GetRootTable(builder.GetBufferPointer());
  TEST_EQ(root_table->far_struct_vector()->size(), far_leaves.size());
  TEST_EQ(root_table->far_struct_vector()->Get(0)->a(), 123);
  TEST_EQ(root_table->far_struct_vector()->Get(0)->b(), 4.567);
  TEST_EQ(root_table->far_struct_vector()->Get(1)->a(), 987);
  TEST_EQ(root_table->far_struct_vector()->Get(1)->b(), 6.543);

  TEST_EQ(root_table->big_struct_vector()->size(), big_leaves.size());
  TEST_EQ(root_table->big_struct_vector()->Get(0)->a(), 72);
  TEST_EQ(root_table->big_struct_vector()->Get(0)->b(), 72.8);
  TEST_EQ(root_table->big_struct_vector()->Get(1)->a(), 82);
  TEST_EQ(root_table->big_struct_vector()->Get(1)->b(), 82.8);
  TEST_EQ(root_table->big_struct_vector()->Get(2)->a(), 92);
  TEST_EQ(root_table->big_struct_vector()->Get(2)->b(), 92.8);
}